

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_MoniteredItem_SampleCallback(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  UA_Subscription *pUVar1;
  UA_StatusCode UVar2;
  undefined4 uVar3;
  UA_Byte aUStack_408 [408];
  undefined8 uStack_270;
  uint local_268;
  uint local_260;
  uint local_258;
  uint local_250;
  uint local_248;
  uint local_240;
  uint local_238;
  uint local_230;
  uint local_228;
  uint local_220;
  UA_UInt32 local_218;
  undefined8 local_210;
  uint local_208;
  uint local_204;
  uint local_200;
  UA_UInt32 local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  UA_Logger local_1e8;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  UA_UInt32 local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  UA_Logger local_1c0;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  UA_UInt32 local_1ac;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  UA_Logger local_198;
  uint local_190;
  uint local_18c;
  uint local_188;
  UA_UInt32 local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  UA_Logger local_170;
  UA_ReadValueId *local_168;
  UA_DataValue *local_160;
  uint local_158;
  uint local_154;
  uint local_150;
  UA_UInt32 local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  UA_Logger local_138;
  undefined1 local_130 [8];
  UA_ByteString cbs;
  MonitoredItem_queuedValue *newQueueItem;
  UA_StatusCode retval;
  UA_Boolean changed;
  UA_ByteString valueEncoding;
  UA_Byte *stackValueEncoding;
  UA_DataValue value;
  UA_ReadValueId rvid;
  UA_Subscription *sub;
  UA_MonitoredItem *monitoredItem_local;
  UA_Server *server_local;
  
  pUVar1 = monitoredItem->subscription;
  if (monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
    local_138 = (server->config).logger;
    if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
      local_140 = 0;
    }
    else {
      if (pUVar1->session->channel->connection == (UA_Connection *)0x0) {
        local_13c = 0;
      }
      else {
        local_13c = pUVar1->session->channel->connection->sockfd;
      }
      local_140 = local_13c;
    }
    local_144 = local_140;
    if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
      local_148 = 0;
    }
    else {
      local_148 = (pUVar1->session->channel->securityToken).channelId;
    }
    local_260 = (uint)(pUVar1->session->sessionId).identifier.guid.data3;
    local_258 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[0];
    local_250 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[1];
    local_218 = pUVar1->subscriptionID;
    local_14c = monitoredItem->itemId;
    local_268 = (uint)(pUVar1->session->sessionId).identifier.guid.data2;
    local_248 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[2];
    local_240 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[3];
    local_238 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[4];
    local_230 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[5];
    local_228 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[6];
    local_220 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[7];
    local_210 = CONCAT44(local_210._4_4_,local_14c);
    uStack_270 = 0x133ad1;
    local_158 = local_260;
    local_154 = local_258;
    local_150 = local_250;
    UA_LOG_DEBUG(local_138,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Not a data change notification"
                 ,(ulong)local_140,(ulong)local_148,
                 (ulong)(pUVar1->session->sessionId).identifier.numeric);
    return;
  }
  local_168 = (UA_ReadValueId *)&value.serverPicoseconds;
  local_210 = 0x133aed;
  UA_ReadValueId_init(local_168);
  value.serverPicoseconds = (monitoredItem->monitoredNodeId).namespaceIndex;
  value._90_2_ = *(undefined2 *)&(monitoredItem->monitoredNodeId).field_0x2;
  value._92_4_ = (monitoredItem->monitoredNodeId).identifierType;
  local_160 = (UA_DataValue *)&stackValueEncoding;
  local_210 = 0x133b2d;
  UA_DataValue_init(local_160);
  local_210 = 0x133b53;
  Service_Read_single(server,pUVar1->session,monitoredItem->timestampsToReturn,local_168,local_160);
  valueEncoding.length = (size_t)aUStack_408;
  _retval = 0x200;
  newQueueItem._7_1_ = 0;
  valueEncoding.data = (UA_Byte *)valueEncoding.length;
  newQueueItem._0_4_ =
       detectValueChange(monitoredItem,(UA_DataValue *)&stackValueEncoding,(UA_ByteString *)&retval,
                         (UA_Boolean *)((long)&newQueueItem + 7));
  if (((newQueueItem._7_1_ & 1) != 0) && ((UA_StatusCode)newQueueItem == 0)) {
    uVar3 = 0;
    cbs.data = (UA_Byte *)malloc(0x78);
    if (cbs.data != (UA_Byte *)0x0) {
      if ((UA_Byte *)valueEncoding.length == valueEncoding.data) {
        uVar3 = 0;
        UVar2 = UA_ByteString_copy((UA_ByteString *)&retval,(UA_ByteString *)local_130);
        if (UVar2 != 0) {
          local_198 = (server->config).logger;
          if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
            local_1a0 = 0;
          }
          else {
            if (pUVar1->session->channel->connection == (UA_Connection *)0x0) {
              local_19c = 0;
            }
            else {
              local_19c = pUVar1->session->channel->connection->sockfd;
            }
            local_1a0 = local_19c;
          }
          local_1a4 = local_1a0;
          if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
            local_1a8 = 0;
          }
          else {
            local_1a8 = (pUVar1->session->channel->securityToken).channelId;
          }
          local_1b8 = (uint)(pUVar1->session->sessionId).identifier.guid.data3;
          local_1b4 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[0];
          local_1b0 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[1];
          local_1ac = monitoredItem->itemId;
          UA_LOG_WARNING(local_198,UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | ByteString to compare values could not be created"
                         ,(ulong)local_1a0,(ulong)local_1a8,
                         (ulong)(pUVar1->session->sessionId).identifier.numeric,
                         (uint)(pUVar1->session->sessionId).identifier.guid.data2,local_1b8,
                         local_1b4,local_1b0,
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[2],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[3],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[4],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[5],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[6],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[7],
                         pUVar1->subscriptionID,CONCAT44(uVar3,local_1ac));
          free(cbs.data);
          goto LAB_0013458e;
        }
        _retval = (size_t)local_130;
        valueEncoding.length = cbs.length;
      }
      if ((((byte)stackValueEncoding & 1) == 0) || ((int)value.value.type != 1)) {
        uVar3 = 0;
        memcpy(cbs.data + 0x18,&stackValueEncoding,0x60);
      }
      else {
        uVar3 = 0;
        UVar2 = UA_DataValue_copy((UA_DataValue *)&stackValueEncoding,
                                  (UA_DataValue *)(cbs.data + 0x18));
        if (UVar2 != 0) {
          local_1c0 = (server->config).logger;
          if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
            local_1c8 = 0;
          }
          else {
            if (pUVar1->session->channel->connection == (UA_Connection *)0x0) {
              local_1c4 = 0;
            }
            else {
              local_1c4 = pUVar1->session->channel->connection->sockfd;
            }
            local_1c8 = local_1c4;
          }
          local_1cc = local_1c8;
          if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
            local_1d0 = 0;
          }
          else {
            local_1d0 = (pUVar1->session->channel->securityToken).channelId;
          }
          local_1e0 = (uint)(pUVar1->session->sessionId).identifier.guid.data3;
          local_1dc = (uint)(pUVar1->session->sessionId).identifier.guid.data4[0];
          local_1d8 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[1];
          local_1d4 = monitoredItem->itemId;
          UA_LOG_WARNING(local_1c0,UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be prepared"
                         ,(ulong)local_1c8,(ulong)local_1d0,
                         (ulong)(pUVar1->session->sessionId).identifier.numeric,
                         (uint)(pUVar1->session->sessionId).identifier.guid.data2,local_1e0,
                         local_1dc,local_1d8,
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[2],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[3],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[4],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[5],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[6],
                         (uint)(pUVar1->session->sessionId).identifier.guid.data4[7],
                         pUVar1->subscriptionID,CONCAT44(uVar3,local_1d4));
          free(cbs.data);
          goto LAB_0013458e;
        }
      }
      *(UA_UInt32 *)(cbs.data + 0x10) = monitoredItem->clientHandle;
      local_1e8 = (server->config).logger;
      if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
        local_1f0 = 0;
      }
      else {
        if (pUVar1->session->channel->connection == (UA_Connection *)0x0) {
          local_1ec = 0;
        }
        else {
          local_1ec = pUVar1->session->channel->connection->sockfd;
        }
        local_1f0 = local_1ec;
      }
      local_1f4 = local_1f0;
      if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
        local_1f8 = 0;
      }
      else {
        local_1f8 = (pUVar1->session->channel->securityToken).channelId;
      }
      local_208 = (uint)(pUVar1->session->sessionId).identifier.guid.data3;
      local_204 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[0];
      local_200 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[1];
      local_1fc = monitoredItem->itemId;
      UA_LOG_DEBUG(local_1e8,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %u | Sampled a new value"
                   ,(ulong)local_1f0,(ulong)local_1f8,
                   (ulong)(pUVar1->session->sessionId).identifier.numeric,
                   (uint)(pUVar1->session->sessionId).identifier.guid.data2,local_208,local_204,
                   local_200,(uint)(pUVar1->session->sessionId).identifier.guid.data4[2],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[3],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[4],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[5],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[6],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[7],
                   pUVar1->subscriptionID,CONCAT44(uVar3,local_1fc));
      UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
      (monitoredItem->lastSampledValue).length = _retval;
      (monitoredItem->lastSampledValue).data = (UA_Byte *)valueEncoding.length;
      ensureSpaceInMonitoredItemQueue(monitoredItem);
      cbs.data[0] = '\0';
      cbs.data[1] = '\0';
      cbs.data[2] = '\0';
      cbs.data[3] = '\0';
      cbs.data[4] = '\0';
      cbs.data[5] = '\0';
      cbs.data[6] = '\0';
      cbs.data[7] = '\0';
      *(MonitoredItem_queuedValue ***)(cbs.data + 8) = (monitoredItem->queue).tqh_last;
      *(monitoredItem->queue).tqh_last = (MonitoredItem_queuedValue *)cbs.data;
      (monitoredItem->queue).tqh_last = (MonitoredItem_queuedValue **)cbs.data;
      monitoredItem->currentQueueSize = monitoredItem->currentQueueSize + 1;
      return;
    }
    local_170 = (server->config).logger;
    if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
      local_178 = 0;
    }
    else {
      if (pUVar1->session->channel->connection == (UA_Connection *)0x0) {
        local_174 = 0;
      }
      else {
        local_174 = pUVar1->session->channel->connection->sockfd;
      }
      local_178 = local_174;
    }
    local_17c = local_178;
    if (pUVar1->session->channel == (UA_SecureChannel *)0x0) {
      local_180 = 0;
    }
    else {
      local_180 = (pUVar1->session->channel->securityToken).channelId;
    }
    local_190 = (uint)(pUVar1->session->sessionId).identifier.guid.data3;
    local_18c = (uint)(pUVar1->session->sessionId).identifier.guid.data4[0];
    local_188 = (uint)(pUVar1->session->sessionId).identifier.guid.data4[1];
    local_184 = monitoredItem->itemId;
    UA_LOG_WARNING(local_170,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be allocated"
                   ,(ulong)local_178,(ulong)local_180,
                   (ulong)(pUVar1->session->sessionId).identifier.numeric,
                   (uint)(pUVar1->session->sessionId).identifier.guid.data2,local_190,local_18c,
                   local_188,(uint)(pUVar1->session->sessionId).identifier.guid.data4[2],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[3],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[4],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[5],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[6],
                   (uint)(pUVar1->session->sessionId).identifier.guid.data4[7],
                   pUVar1->subscriptionID,CONCAT44(uVar3,local_184));
  }
LAB_0013458e:
  if ((UA_Byte *)valueEncoding.length != valueEncoding.data) {
    UA_ByteString_deleteMembers((UA_ByteString *)&retval);
  }
  UA_DataValue_deleteMembers((UA_DataValue *)&stackValueEncoding);
  return;
}

Assistant:

void UA_MoniteredItem_SampleCallback(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    UA_Subscription *sub = monitoredItem->subscription;
    if(monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | MonitoredItem %i | "
                             "Not a data change notification",
                             sub->subscriptionID, monitoredItem->itemId);
        return;
    }

    /* Read the value */
    UA_ReadValueId rvid;
    UA_ReadValueId_init(&rvid);
    rvid.nodeId = monitoredItem->monitoredNodeId;
    rvid.attributeId = monitoredItem->attributeID;
    rvid.indexRange = monitoredItem->indexRange;
    UA_DataValue value;
    UA_DataValue_init(&value);
    Service_Read_single(server, sub->session, monitoredItem->timestampsToReturn,
                        &rvid, &value);

    /* Stack-allocate some memory for the value encoding */
    UA_Byte *stackValueEncoding = UA_alloca(UA_VALUENCODING_MAXSTACK);
    UA_ByteString valueEncoding;
    valueEncoding.data = stackValueEncoding;
    valueEncoding.length = UA_VALUENCODING_MAXSTACK;

    /* Has the value changed? */
    UA_Boolean changed = false;
    UA_StatusCode retval = detectValueChange(monitoredItem, &value,
                                             &valueEncoding, &changed);
    if(!changed || retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    /* Allocate the entry for the publish queue */
    MonitoredItem_queuedValue *newQueueItem = UA_malloc(sizeof(MonitoredItem_queuedValue));
    if(!newQueueItem) {
        UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                               "Subscription %u | MonitoredItem %i | "
                               "Item for the publishing queue could not be allocated",
                               sub->subscriptionID, monitoredItem->itemId);
        goto cleanup;
    }

    /* Copy valueEncoding on the heap for the next comparison (if not already done) */
    if(valueEncoding.data == stackValueEncoding) {
        UA_ByteString cbs;
        if(UA_ByteString_copy(&valueEncoding, &cbs) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "ByteString to compare values could not be created",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
        valueEncoding = cbs;
    }

    /* Prepare the newQueueItem */
    if(value.hasValue && value.value.storageType == UA_VARIANT_DATA_NODELETE) {
        if(UA_DataValue_copy(&value, &newQueueItem->value) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "Item for the publishing queue could not be prepared",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
    } else {
        newQueueItem->value = value;
    }
    newQueueItem->clientHandle = monitoredItem->clientHandle;

    /* <-- Point of no return --> */

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | MonitoredItem %u | Sampled a new value",
                         sub->subscriptionID, monitoredItem->itemId);

    /* Replace the encoding for comparison */
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    monitoredItem->lastSampledValue = valueEncoding;

    /* Add the sample to the queue for publication */
    ensureSpaceInMonitoredItemQueue(monitoredItem);
    TAILQ_INSERT_TAIL(&monitoredItem->queue, newQueueItem, listEntry);
    ++monitoredItem->currentQueueSize;
    return;

 cleanup:
    if(valueEncoding.data != stackValueEncoding)
        UA_ByteString_deleteMembers(&valueEncoding);
    UA_DataValue_deleteMembers(&value);
}